

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.cc
# Opt level: O3

void bsplib::TicToc::print_stats(MPI_Comm comm,ostream *out)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t sVar6;
  ostream *poVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int j;
  int iVar13;
  long lVar14;
  int k;
  long lVar15;
  double dVar16;
  double dVar17;
  int P;
  size_t max_count;
  size_t local_count;
  vector<double,_std::allocator<double>_> allrecords;
  char local_71;
  double *local_70;
  int local_64;
  long local_60;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  MPI_Comm local_38;
  
  MPI_Comm_size(comm,&local_64);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,(long)local_64 << 2,(allocator_type *)&local_58);
  local_70 = (double *)operator_new(0x20);
  local_70[2] = 0.0;
  local_70[3] = 0.0;
  *local_70 = 0.0;
  local_70[1] = 0.0;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"        seconds PID        MB PID    MB/sec PID     Count PID\n",0x3e);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 3;
  if (0x20 < (ulong)(DAT_00119318 - s_timers)) {
    uVar12 = 1;
    local_38 = comm;
    do {
      lVar10 = uVar12 * 0x20;
      local_58 = *(undefined8 *)(s_timers + 0x18 + lVar10);
      local_60 = 0;
      MPI_Allreduce(&local_58,&local_60,1,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,comm);
      lVar14 = s_timers;
      if (local_60 != 0) {
        dVar16 = (double)*(long *)(s_timers + 8 + lVar10) * 1e-09 +
                 (double)*(long *)(s_timers + lVar10);
        *local_70 = dVar16;
        uVar1 = *(undefined8 *)(lVar14 + 0x10 + lVar10);
        dVar17 = (((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25
                  ) + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06;
        local_70[1] = dVar17;
        local_70[2] = dVar17 / dVar16;
        uVar1 = *(undefined8 *)(lVar14 + 0x18 + lVar10);
        local_70[3] = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) -
                      1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        MPI_Allgather(local_70,4,&ompi_mpi_double,
                      local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,4,&ompi_mpi_double,comm);
        lVar14 = 0;
        do {
          pcVar2 = (&PTR_anon_var_dwarf_4b943_00118d10)[lVar14];
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
          lVar10 = 0x20;
          lVar15 = 0;
          do {
            dVar16 = local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15];
            iVar13 = 0;
            if (1 < (long)local_64) {
              pdVar8 = (double *)
                       ((long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar10);
              uVar11 = 0;
              uVar9 = 1;
              do {
                dVar17 = *pdVar8;
                iVar13 = (int)lVar14;
                if (iVar13 == 2) {
                  dVar16 = dVar16 + dVar17;
                }
                else if (iVar13 == 1) {
                  if (dVar16 < dVar17) goto LAB_0011052d;
                }
                else if ((iVar13 == 0) && (dVar17 < dVar16)) {
LAB_0011052d:
                  uVar11 = uVar9 & 0xffffffff;
                  dVar16 = dVar17;
                }
                iVar13 = (int)uVar11;
                uVar9 = uVar9 + 1;
                pdVar8 = pdVar8 + 4;
              } while ((long)local_64 != uVar9);
            }
            *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 10;
            if (lVar14 == 2) {
              poVar7 = std::ostream::_M_insert<double>(dVar16 / (double)local_64);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
            }
            else {
              poVar7 = std::ostream::_M_insert<double>(dVar16);
              *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 4;
              std::ostream::operator<<((ostream *)poVar7,iVar13);
            }
            lVar15 = lVar15 + 1;
            lVar10 = lVar10 + 8;
          } while (lVar15 != 4);
          uVar9 = 1;
          do {
            local_71 = ' ';
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_71,1);
            *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x10;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar9;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar12;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = SUB168(auVar4 / auVar3,0);
            pcVar2 = *(char **)((long)&PTR_anon_var_dwarf_4b83f_00118c90 +
                               (ulong)((SUB164(auVar4 / auVar3,0) +
                                       (SUB164(auVar5 * ZEXT816(0x8888888888888889),8) >> 3) * -0xf)
                                      * 8));
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar2,sVar6);
            uVar9 = uVar9 * 0xf;
          } while (uVar9 < uVar12);
          local_71 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_71,1);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        local_71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_71,1);
        comm = local_38;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(DAT_00119318 - s_timers >> 5));
  }
  operator_delete(local_70,0x20);
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TicToc::print_stats(MPI_Comm comm, std::ostream & out)
    {
        const char * names[] = 
          { "DUMMY", "TOTAL", "SYNC", "PUT", "GET", "HPPUT", "HPGET", 
            "BSMP", "MPI_META_A2A", "MPI_SMALL_A2A", "MPI_LARGE_RECV",
            "MPI_LARGE_SEND", "MPI_PUT", "MPI_UNBUF",
            "IMBALANCE",
            "UNKNOWN"
          };
        const char * op[] = { "Min", "Max", "Avg" };
        enum { Min, Max, Avg };
        const int s=0, mb=1, mbs=2, count=3;

        int P; MPI_Comm_size( comm, &P);
        std::vector< double > allrecords(4*P), record(4);

        out << "        seconds PID        MB PID    MB/sec PID     Count PID\n";
        out << std::setprecision(3);
        for (size_t i = 1; i < s_timers.size(); ++i ) {

            std::size_t local_count = s_timers[i].count, max_count = 0;
            MPI_Allreduce( &local_count, &max_count, 1, MY_MPI_SIZE_T, 
                    MPI_MAX, comm );
            if (max_count == 0 ) continue;

            record[s]     = sec( s_timers[i].time );
            record[mb]    = s_timers[i].nbytes * 1e-6;
            record[mbs]   = record[mb] / record[s];
            record[count] = 1.0 * s_timers[i].count;

            MPI_Allgather( record.data(), 4, MPI_DOUBLE,
                    allrecords.data(), 4, MPI_DOUBLE,
                    comm );

            for (int j = 0; j < 3; ++j ) {
                out << op[j] << "  ";

                for (int k = 0; k < 4; ++k ) {
                    double x = allrecords[k];
                    int pid  = 0;
                    for (int p = 1; p < P; ++p) {
                        double y = allrecords[p*4+k];
                        switch( j )  {
                            case Min: if ( y < x ) { x = y; pid = p; }
                                      break;
                            case Max: if ( y > x ) { x = y; pid = p; }
                                      break;
                            case Avg: x += y;
                                      break;
                        }
                    }
                    if (j == Avg) { 
                        out << std::setw(10) << (x/P) << "    ";
                    } else {
                        out << std::setw(10) << x << std::setw(4) << pid;
                    }

                }

                size_t pos = i;
                size_t pow = 1;
                do {
                    unsigned j = (pos / pow) % N_CATEGORIES;
                    pow *= N_CATEGORIES;

                    out << ' ' << std::setw(16) << names[j];

                } while (pos > pow);
                out << '\n';
            }
            out << '\n';    
        }
    }